

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (DescribeWalletAddressVisitor *this,ScriptHash *scripthash)

{
  long *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue *obj;
  CScript subscript;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  ScriptHash *script_hash;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar1;
  undefined1 local_5c [20];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_ffffffffffffff40);
  UniValue::UniValue((UniValue *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                     (VType)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                     (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  CScript::CScript((CScript *)in_stack_ffffffffffffff28);
  bVar1 = 0;
  if (*in_RSI != 0) {
    script_hash = (ScriptHash *)*in_RSI;
    ToScriptID(script_hash);
    bVar1 = (**(code **)(*(long *)(script_hash->super_BaseHash<uint160>).m_hash.
                                  super_base_blob<160U>.m_data._M_elems + 0x10))
                      (script_hash,local_5c,local_48);
  }
  if ((bVar1 & 1) != 0) {
    ProcessSubScript((DescribeWalletAddressVisitor *)obj,(CScript *)this,(UniValue *)scripthash);
  }
  CScript::~CScript((CScript *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const ScriptHash& scripthash) const
    {
        UniValue obj(UniValue::VOBJ);
        CScript subscript;
        if (provider && provider->GetCScript(ToScriptID(scripthash), subscript)) {
            ProcessSubScript(subscript, obj);
        }
        return obj;
    }